

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opbehavior.cc
# Opt level: O2

uintb __thiscall
OpBehavior::recoverInputBinary
          (OpBehavior *this,int4 slot,int4 sizeout,uintb out,int4 sizein,uintb in)

{
  LowlevelError *this_00;
  undefined4 in_register_00000014;
  undefined4 in_register_00000034;
  allocator local_39;
  string local_38;
  
  this_00 = (LowlevelError *)
            __cxa_allocate_exception
                      (0x20,CONCAT44(in_register_00000034,slot),
                       CONCAT44(in_register_00000014,sizeout));
  std::__cxx11::string::string
            ((string *)&local_38,"Cannot recover input parameter without loss of information",
             &local_39);
  LowlevelError::LowlevelError(this_00,&local_38);
  __cxa_throw(this_00,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
}

Assistant:

uintb OpBehavior::recoverInputBinary(int4 slot,int4 sizeout,uintb out,int4 sizein,uintb in) const

{
  throw LowlevelError("Cannot recover input parameter without loss of information");
}